

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

optional<Patch::Change> * __thiscall
Patch::grab_change_ending_after_new_position
          (optional<Patch::Change> *__return_storage_ptr__,Patch *this,Point target,bool exclusive)

{
  uint uVar1;
  Node *pNVar2;
  optional<Point> exclusive_lower_bound_00;
  Change local_98;
  Point local_58;
  uint local_50;
  Point local_48;
  uint local_40;
  Patch *local_3c;
  optional<Point> local_34;
  undefined1 local_28 [8];
  optional<Point> exclusive_lower_bound;
  bool exclusive_local;
  Patch *this_local;
  Point target_local;
  
  exclusive_lower_bound.value.column._3_1_ = exclusive;
  unique0x100000d5 = this;
  this_local = (Patch *)target;
  optional<Point>::optional((optional<Point> *)local_28);
  if ((exclusive_lower_bound.value.column._3_1_ & 1) != 0) {
    optional<Point>::optional(&local_34,(Point *)&this_local);
    local_28._0_4_ = local_34.value.row;
    local_28._4_4_ = local_34.value.column;
    exclusive_lower_bound.value.row =
         CONCAT31(exclusive_lower_bound.value.row._1_3_,local_34.is_some);
  }
  local_3c = this_local;
  local_48.row = local_28._0_4_;
  local_48.column = local_28._4_4_;
  local_40 = exclusive_lower_bound.value.row;
  local_58.row = local_28._0_4_;
  local_58.column = local_28._4_4_;
  local_50 = exclusive_lower_bound.value.row;
  uVar1 = local_50;
  local_50._0_1_ = (undefined1)exclusive_lower_bound.value.row;
  exclusive_lower_bound_00.is_some = (bool)(undefined1)local_50;
  exclusive_lower_bound_00.value.row = local_28._0_4_;
  exclusive_lower_bound_00.value.column = local_28._4_4_;
  exclusive_lower_bound_00._9_3_ = 0;
  local_50 = uVar1;
  pNVar2 = splay_node_ending_after<Patch::NewCoordinates>
                     (this,(Point)this_local,exclusive_lower_bound_00);
  if (pNVar2 == (Node *)0x0) {
    optional<Patch::Change>::optional(__return_storage_ptr__);
  }
  else {
    change_for_root_node(&local_98,this);
    optional<Patch::Change>::optional(__return_storage_ptr__,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<Change> Patch::grab_change_ending_after_new_position(Point target, bool exclusive) {
  optional<Point> exclusive_lower_bound;
  if (exclusive) exclusive_lower_bound = target;
  if (splay_node_ending_after<NewCoordinates>(target, exclusive_lower_bound)) {
    return change_for_root_node();
  } else {
    return optional<Change>{};
  }
}